

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O0

Result wabt::anon_unknown_0::FloatParser<float>::Parse
                 (LiteralType literal_type,char *s,char *end,Uint *out_bits)

{
  Uint *out_bits_local;
  char *end_local;
  char *s_local;
  LiteralType literal_type_local;
  
  s_local._0_4_ = literal_type;
  switch(literal_type) {
  case Int:
  case Float:
    s_local._4_4_ = ParseFloat(s,end,out_bits);
    break;
  case Hexfloat:
    s_local._4_4_ = ParseHex(s,end,out_bits);
    break;
  case Infinity:
    ParseInfinity(s,end,out_bits);
    Result::Result((Result *)((long)&s_local + 4),Ok);
    break;
  case Nan:
    s_local._4_4_ = ParseNan(s,end,out_bits);
    break;
  default:
    abort();
  }
  return (Result)s_local._4_4_;
}

Assistant:

Result FloatParser<T>::Parse(LiteralType literal_type,
                             const char* s,
                             const char* end,
                             Uint* out_bits) {
#if COMPILER_IS_MSVC
  if (literal_type == LiteralType::Int && StringStartsWith(s, end, "0x")) {
    // Some MSVC crt implementation of strtof doesn't support hex strings
    literal_type = LiteralType::Hexfloat;
  }
#endif
  switch (literal_type) {
    case LiteralType::Int:
    case LiteralType::Float:
      return ParseFloat(s, end, out_bits);

    case LiteralType::Hexfloat:
      return ParseHex(s, end, out_bits);

    case LiteralType::Infinity:
      ParseInfinity(s, end, out_bits);
      return Result::Ok;

    case LiteralType::Nan:
      return ParseNan(s, end, out_bits);
  }

  WABT_UNREACHABLE;
}